

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_set_sr(DisasContext_conflict2 *s,TCGv_i32 val,int ccr_only)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGContext_conflict2 *tcg_ctx;
  int ccr_only_local;
  TCGv_i32 val_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (ccr_only == 0) {
    gen_helper_set_sr(tcg_ctx_00,tcg_ctx_00->cpu_env,val);
  }
  else {
    gen_helper_set_ccr(tcg_ctx_00,tcg_ctx_00->cpu_env,val);
  }
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static void gen_set_sr(DisasContext *s, TCGv val, int ccr_only)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (ccr_only) {
        gen_helper_set_ccr(tcg_ctx, tcg_ctx->cpu_env, val);
    } else {
        gen_helper_set_sr(tcg_ctx, tcg_ctx->cpu_env, val);
    }
    set_cc_op(s, CC_OP_FLAGS);
}